

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoMocUic::JobEvaluateT::MocEvalSource(JobEvaluateT *this,SourceFileHandleT *source)

{
  shared_ptr<cmQtAutoMocUic::SourceFileT> *this_00;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  element_type *filename;
  element_type *text;
  ulong uVar6;
  MocSettingsT *pMVar7;
  IncludeT *pIVar8;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *pvVar9;
  element_type *peVar10;
  Logger *pLVar11;
  reference pIVar12;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_798;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_788;
  string local_778;
  string local_758;
  allocator<char> local_731;
  undefined1 local_730 [8];
  string msg_6;
  string local_6f0;
  string local_6d0;
  allocator<char> local_6a9;
  undefined1 local_6a8 [8];
  string msg_5;
  bool ownMoc_1;
  IncludeKeyT *incKey_4;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *__range2_2;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  string local_600;
  string local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_580;
  string local_560;
  allocator<char> local_539;
  undefined1 local_538 [8];
  string msg_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  allocator<char> local_451;
  undefined1 local_450 [8];
  string msg_3;
  string local_410;
  allocator<char> local_3e9;
  undefined1 local_3e8 [8];
  string msg_2;
  SourceFileHandleT header_1;
  string headerBase_1;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_388;
  byte local_371;
  reference pIStack_370;
  bool ownMoc;
  IncludeKeyT *incKey_3;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *__range2_1;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_340;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_330;
  shared_ptr<cmQtAutoMocUic::SourceFileT> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  allocator<char> local_229;
  undefined1 local_228 [8];
  string msg_1;
  string local_1e8;
  allocator<char> local_1c1;
  undefined1 local_1c0 [8];
  string msg;
  SourceFileHandleT header;
  string headerBase;
  IncludeKeyT *incKey_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string emsg;
  IncludeKeyT *incKey_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *__range1;
  IncludeKeyT *incKey;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *__range2;
  bool sourceIncludesDotMoc;
  bool sourceIncludesMocUnderscore;
  bool relaxedMode;
  undefined1 local_70 [8];
  string sourceBase;
  string sourceDir;
  MocT *parseData;
  SourceFileT *sourceFile;
  SourceFileHandleT *source_local;
  JobEvaluateT *this_local;
  
  filename = std::
             __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)source);
  text = std::
         __shared_ptr_access<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&filename->ParseData);
  if (((filename->Moc & 1U) == 0) ||
     (((uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0 &&
       (bVar5 = std::
                vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
                empty(&(text->Moc).Include.Underscore), bVar5)) &&
      (bVar5 = std::
               vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
               empty(&(text->Moc).Include.Dot), bVar5)))) {
    this_local._7_1_ = 1;
  }
  else {
    cmQtAutoGen::SubDirPrefix((string *)((long)&sourceBase.field_2 + 8),&filename->FileName);
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_70,&filename->FileName);
    pMVar7 = JobT::MocConst((JobT *)this);
    bVar1 = pMVar7->RelaxedMode & 1;
    bVar3 = false;
    bVar5 = false;
    if (bVar1 != 0) {
      pIVar8 = &(text->Moc).Include;
      __end2 = std::
               vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
               begin(&pIVar8->Underscore);
      incKey = (IncludeKeyT *)
               std::
               vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
               end(&pIVar8->Underscore);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                                         *)&incKey), bVar2) {
        pIVar12 = __gnu_cxx::
                  __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                  ::operator*(&__end2);
        _Var4 = std::operator==(&pIVar12->Base,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_70);
        if (_Var4) {
          bVar3 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
        ::operator++(&__end2);
      }
    }
    pvVar9 = &(text->Moc).Include.Dot;
    __end1 = std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
             ::begin(pvVar9);
    incKey_1 = (IncludeKeyT *)
               std::
               vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
               end(pvVar9);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                                       *)&incKey_1), bVar2) {
      emsg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
           ::operator*(&__end1);
      _Var4 = std::operator==(&((reference)emsg.field_2._8_8_)->Base,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70);
      if (_Var4) {
        bVar5 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
      ::operator++(&__end1);
    }
    if (((bVar5) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) ||
       ((bVar1 != 0 && (bVar3)))) {
      pIVar8 = &(text->Moc).Include;
      __end1_1 = std::
                 vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
                 begin(&pIVar8->Underscore);
      incKey_2 = (IncludeKeyT *)
                 std::
                 vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>::
                 end(&pIVar8->Underscore);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                                 *)&incKey_2), bVar3) {
        pIVar12 = __gnu_cxx::
                  __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                  ::operator*(&__end1_1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &header.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&pIVar12->Dir,&pIVar12->Base);
        MocFindIncludedHeader
                  ((JobEvaluateT *)((long)&msg.field_2 + 8),(string *)this,
                   (string *)((long)&sourceBase.field_2 + 8));
        bVar3 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)(msg.field_2._M_local_buf + 8));
        if (bVar3) {
          if ((((bVar1 == 0) || (bVar5)) ||
              (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) ||
             (_Var4 = std::operator==(&pIVar12->Base,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_70), !_Var4)) {
            pMVar7 = JobT::MocConst((JobT *)this);
            peVar10 = std::
                      __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)(msg.field_2._M_local_buf + 8));
            bVar3 = MocSettingsT::skipped(pMVar7,&peVar10->FileName);
            if (bVar3) {
              __range1_1._4_4_ = 7;
            }
            else {
              std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_340,source);
              std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr
                        ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_1,
                         (shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&msg.field_2 + 8));
              bVar3 = MocRegisterIncluded(this,&pIVar12->Key,&local_340,
                                          (shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_1,
                                          true);
              std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                        ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_1);
              std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_340);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                __range1_1._4_4_ = 0;
              }
              else {
                this_local._7_1_ = 0;
                __range1_1._4_4_ = 1;
              }
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_228,"The file contains a ",&local_229);
            std::allocator<char>::~allocator(&local_229);
            cmQtAutoGen::Quoted(&local_250,(string *)text);
            std::__cxx11::string::operator+=((string *)local_228,(string *)&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::operator+=((string *)local_228," macro, but does not include ");
            std::operator+(&local_290,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,".moc");
            cmQtAutoGen::Quoted(&local_270,&local_290);
            std::__cxx11::string::operator+=((string *)local_228,(string *)&local_270);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::operator+=((string *)local_228,".\nInstead it includes ");
            cmQtAutoGen::Quoted(&local_2b0,&pIVar12->Key);
            std::__cxx11::string::operator+=((string *)local_228,(string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::__cxx11::string::operator+=((string *)local_228,".\nRunning moc on the source\n  ")
            ;
            cmQtAutoGen::Quoted(&local_2d0,&filename->FileName);
            std::__cxx11::string::operator+=((string *)local_228,(string *)&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::__cxx11::string::operator+=((string *)local_228,"!\nBetter include ");
            std::operator+(&local_310,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,".moc");
            cmQtAutoGen::Quoted(&local_2f0,&local_310);
            std::__cxx11::string::operator+=((string *)local_228,(string *)&local_2f0);
            std::__cxx11::string::~string((string *)&local_2f0);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::string::operator+=
                      ((string *)local_228," for compatibility with regular mode.\n");
            std::__cxx11::string::operator+=
                      ((string *)local_228,"This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n");
            pLVar11 = JobT::Log((JobT *)this);
            cmQtAutoGenerator::Logger::WarningFile
                      (pLVar11,MOC,&filename->FileName,(string *)local_228);
            std::__cxx11::string::~string((string *)local_228);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_320,source);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_330,source);
            bVar3 = MocRegisterIncluded(this,&pIVar12->Key,&local_320,&local_330,false);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_330);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_320);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              __range1_1._4_4_ = 7;
            }
            else {
              this_local._7_1_ = 0;
              __range1_1._4_4_ = 1;
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1c0,"The file includes the moc file ",&local_1c1);
          std::allocator<char>::~allocator(&local_1c1);
          cmQtAutoGen::Quoted(&local_1e8,&pIVar12->Key);
          std::__cxx11::string::operator+=((string *)local_1c0,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::operator+=
                    ((string *)local_1c0,
                     ",\nbut the header could not be found in the following locations\n");
          MocMessageTestHeaders
                    ((string *)((long)&msg_1.field_2 + 8),this,
                     (string *)
                     &header.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::operator+=
                    ((string *)local_1c0,(string *)(msg_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
          JobT::LogFileError((JobT *)this,MOC,&filename->FileName,(string *)local_1c0);
          std::__cxx11::string::~string((string *)local_1c0);
          this_local._7_1_ = 0;
          __range1_1._4_4_ = 1;
        }
        std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                  ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&msg.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)
                   &header.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if ((__range1_1._4_4_ != 0) && (__range1_1._4_4_ != 7)) goto LAB_001facd3;
        __gnu_cxx::
        __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
        ::operator++(&__end1_1);
      }
      if (bVar1 == 0) {
        pvVar9 = &(text->Moc).Include.Dot;
        __end2_2 = std::
                   vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                   ::begin(pvVar9);
        incKey_4 = (IncludeKeyT *)
                   std::
                   vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                   ::end(pvVar9);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                                   *)&incKey_4), bVar5) {
          pIVar12 = __gnu_cxx::
                    __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                    ::operator*(&__end2_2);
          msg_5.field_2._M_local_buf[0xf] =
               std::operator==(&pIVar12->Base,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_70);
          if (!(bool)msg_5.field_2._M_local_buf[0xf]) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_6a8,"The file includes the moc file ",&local_6a9);
            std::allocator<char>::~allocator(&local_6a9);
            cmQtAutoGen::Quoted(&local_6d0,&pIVar12->Key);
            std::__cxx11::string::operator+=((string *)local_6a8,(string *)&local_6d0);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::operator+=
                      ((string *)local_6a8,
                       ",\nwhich seems to be the moc file from a different source file.\nThis is not supported.  Include "
                      );
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&msg_6.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,".moc");
            cmQtAutoGen::Quoted(&local_6f0,(string *)((long)&msg_6.field_2 + 8));
            std::__cxx11::string::operator+=((string *)local_6a8,(string *)&local_6f0);
            std::__cxx11::string::~string((string *)&local_6f0);
            std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
            std::__cxx11::string::operator+=((string *)local_6a8," to run moc on this source file.")
            ;
            JobT::LogFileError((JobT *)this,MOC,&filename->FileName,(string *)local_6a8);
            this_local._7_1_ = 0;
            std::__cxx11::string::~string((string *)local_6a8);
            goto LAB_001facd3;
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_730,"The file includes the moc file ",&local_731);
            std::allocator<char>::~allocator(&local_731);
            cmQtAutoGen::Quoted(&local_758,&pIVar12->Key);
            std::__cxx11::string::operator+=((string *)local_730,(string *)&local_758);
            std::__cxx11::string::~string((string *)&local_758);
            std::__cxx11::string::operator+=((string *)local_730,", but does not contain a ");
            pMVar7 = JobT::MocConst((JobT *)this);
            MocSettingsT::MacrosString_abi_cxx11_(&local_778,pMVar7);
            std::__cxx11::string::operator+=((string *)local_730,(string *)&local_778);
            std::__cxx11::string::~string((string *)&local_778);
            std::__cxx11::string::operator+=((string *)local_730," macro.");
            pLVar11 = JobT::Log((JobT *)this);
            cmQtAutoGenerator::Logger::WarningFile
                      (pLVar11,MOC,&filename->FileName,(string *)local_730);
            std::__cxx11::string::~string((string *)local_730);
          }
          std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_788,source);
          std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_798,source);
          bVar5 = MocRegisterIncluded(this,&pIVar12->Key,&local_788,&local_798,false);
          std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_798);
          std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_788);
          if (((bVar5 ^ 0xffU) & 1) != 0) {
            this_local._7_1_ = 0;
            goto LAB_001facd3;
          }
          __gnu_cxx::
          __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
          ::operator++(&__end2_2);
        }
      }
      else {
        pvVar9 = &(text->Moc).Include.Dot;
        __end2_1 = std::
                   vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                   ::begin(pvVar9);
        incKey_3 = (IncludeKeyT *)
                   std::
                   vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                   ::end(pvVar9);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                                   *)&incKey_3), bVar5) {
          pIStack_370 = __gnu_cxx::
                        __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
                        ::operator*(&__end2_1);
          local_371 = std::operator==(&pIStack_370->Base,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_70);
          if (((bool)local_371) &&
             (uVar6 = std::__cxx11::string::empty(), pIVar12 = pIStack_370, (uVar6 & 1) == 0)) {
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_388,source);
            this_00 = (shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&headerBase_1.field_2 + 8);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(this_00,source);
            bVar5 = MocRegisterIncluded(this,&pIVar12->Key,&local_388,this_00,false);
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                      ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&headerBase_1.field_2 + 8))
            ;
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_388);
            if (((bVar5 ^ 0xffU) & 1) != 0) {
              this_local._7_1_ = 0;
              goto LAB_001facd3;
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &header_1.
                            super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,&pIStack_370->Dir,&pIStack_370->Base);
            MocFindIncludedHeader
                      ((JobEvaluateT *)((long)&msg_2.field_2 + 8),(string *)this,
                       (string *)((long)&sourceBase.field_2 + 8));
            bVar5 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)(msg_2.field_2._M_local_buf + 8));
            if (bVar5) {
              pMVar7 = JobT::MocConst((JobT *)this);
              peVar10 = std::
                        __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)(msg_2.field_2._M_local_buf + 8));
              bVar5 = MocSettingsT::skipped(pMVar7,&peVar10->FileName);
              if (bVar5) {
                __range1_1._4_4_ = 9;
              }
              else {
                if (((local_371 & 1) == 0) ||
                   (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_538,"The file includes the moc file ",&local_539);
                  std::allocator<char>::~allocator(&local_539);
                  cmQtAutoGen::Quoted(&local_560,&pIStack_370->Key);
                  std::__cxx11::string::operator+=((string *)local_538,(string *)&local_560);
                  std::__cxx11::string::~string((string *)&local_560);
                  std::__cxx11::string::operator+=((string *)local_538," instead of ");
                  std::operator+(&local_5c0,"moc_",&pIStack_370->Base);
                  std::operator+(&local_5a0,&local_5c0,".cpp");
                  cmQtAutoGen::Quoted(&local_580,&local_5a0);
                  std::__cxx11::string::operator+=((string *)local_538,(string *)&local_580);
                  std::__cxx11::string::~string((string *)&local_580);
                  std::__cxx11::string::~string((string *)&local_5a0);
                  std::__cxx11::string::~string((string *)&local_5c0);
                  std::__cxx11::string::operator+=
                            ((string *)local_538,".\nRunning moc on the header\n  ");
                  peVar10 = std::
                            __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)(msg_2.field_2._M_local_buf + 8));
                  cmQtAutoGen::Quoted(&local_5e0,&peVar10->FileName);
                  std::__cxx11::string::operator+=((string *)local_538,(string *)&local_5e0);
                  std::__cxx11::string::~string((string *)&local_5e0);
                  std::__cxx11::string::operator+=((string *)local_538,"!\nBetter include ");
                  std::operator+(&local_640,"moc_",&pIStack_370->Base);
                  std::operator+(&local_620,&local_640,".cpp");
                  cmQtAutoGen::Quoted(&local_600,&local_620);
                  std::__cxx11::string::operator+=((string *)local_538,(string *)&local_600);
                  std::__cxx11::string::~string((string *)&local_600);
                  std::__cxx11::string::~string((string *)&local_620);
                  std::__cxx11::string::~string((string *)&local_640);
                  std::__cxx11::string::operator+=
                            ((string *)local_538," for compatibility with regular mode.\n");
                  std::__cxx11::string::operator+=
                            ((string *)local_538,"This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n");
                  pLVar11 = JobT::Log((JobT *)this);
                  cmQtAutoGenerator::Logger::WarningFile
                            (pLVar11,MOC,&filename->FileName,(string *)local_538);
                  std::__cxx11::string::~string((string *)local_538);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_450,"The file includes the moc file ",&local_451);
                  std::allocator<char>::~allocator(&local_451);
                  cmQtAutoGen::Quoted(&local_478,&pIStack_370->Key);
                  std::__cxx11::string::operator+=((string *)local_450,(string *)&local_478);
                  std::__cxx11::string::~string((string *)&local_478);
                  std::__cxx11::string::operator+=((string *)local_450,", but does not contain a\n")
                  ;
                  pMVar7 = JobT::MocConst((JobT *)this);
                  MocSettingsT::MacrosString_abi_cxx11_(&local_498,pMVar7);
                  std::__cxx11::string::operator+=((string *)local_450,(string *)&local_498);
                  std::__cxx11::string::~string((string *)&local_498);
                  std::__cxx11::string::operator+=
                            ((string *)local_450," macro.\nRunning moc on the header\n  ");
                  peVar10 = std::
                            __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)(msg_2.field_2._M_local_buf + 8));
                  cmQtAutoGen::Quoted(&local_4b8,&peVar10->FileName);
                  std::__cxx11::string::operator+=((string *)local_450,(string *)&local_4b8);
                  std::__cxx11::string::~string((string *)&local_4b8);
                  std::__cxx11::string::operator+=((string *)local_450,"!\nBetter include ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&msg_4.field_2 + 8),"moc_",&pIStack_370->Base);
                  std::operator+(&local_4f8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&msg_4.field_2 + 8),".cpp");
                  cmQtAutoGen::Quoted(&local_4d8,&local_4f8);
                  std::__cxx11::string::operator+=((string *)local_450,(string *)&local_4d8);
                  std::__cxx11::string::~string((string *)&local_4d8);
                  std::__cxx11::string::~string((string *)&local_4f8);
                  std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
                  std::__cxx11::string::operator+=
                            ((string *)local_450," for a compatibility with regular mode.\n");
                  std::__cxx11::string::operator+=
                            ((string *)local_450,"This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n");
                  pLVar11 = JobT::Log((JobT *)this);
                  cmQtAutoGenerator::Logger::WarningFile
                            (pLVar11,MOC,&filename->FileName,(string *)local_450);
                  std::__cxx11::string::~string((string *)local_450);
                }
                pIVar12 = pIStack_370;
                std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr(&local_650,source);
                std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr
                          ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_2,
                           (shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&msg_2.field_2 + 8));
                bVar5 = MocRegisterIncluded(this,&pIVar12->Key,&local_650,
                                            (shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_2,
                                            true);
                std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                          ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)&__range2_2);
                std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr(&local_650);
                if (((bVar5 ^ 0xffU) & 1) == 0) {
                  __range1_1._4_4_ = 0;
                }
                else {
                  this_local._7_1_ = 0;
                  __range1_1._4_4_ = 1;
                }
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3e8,"The file includes the moc file ",&local_3e9);
              std::allocator<char>::~allocator(&local_3e9);
              cmQtAutoGen::Quoted(&local_410,&pIStack_370->Key);
              std::__cxx11::string::operator+=((string *)local_3e8,(string *)&local_410);
              std::__cxx11::string::~string((string *)&local_410);
              std::__cxx11::string::operator+=
                        ((string *)local_3e8,
                         ",\nwhich seems to be the moc file from a different source file.\nCMAKE_AUTOMOC_RELAXED_MODE: Also a matching headercould not be found in the following locations\n"
                        );
              MocMessageTestHeaders
                        ((string *)((long)&msg_3.field_2 + 8),this,
                         (string *)
                         &header_1.
                          super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__cxx11::string::operator+=
                        ((string *)local_3e8,(string *)(msg_3.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
              JobT::LogFileError((JobT *)this,MOC,&filename->FileName,(string *)local_3e8);
              this_local._7_1_ = 0;
              __range1_1._4_4_ = 1;
              std::__cxx11::string::~string((string *)local_3e8);
            }
            std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                      ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)((long)&msg_2.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)
                       &header_1.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if ((__range1_1._4_4_ != 0) && (__range1_1._4_4_ != 9)) goto LAB_001facd3;
          }
          __gnu_cxx::
          __normal_iterator<const_cmQtAutoMocUic::IncludeKeyT_*,_std::vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>_>
          ::operator++(&__end2_1);
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"The file contains a ",&local_e1);
      std::allocator<char>::~allocator(&local_e1);
      cmQtAutoGen::Quoted(&local_108,(string *)text);
      std::__cxx11::string::operator+=((string *)local_e0,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::operator+=((string *)local_e0," macro, but does not include ");
      std::operator+(&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     ".moc");
      cmQtAutoGen::Quoted(&local_128,&local_148);
      std::__cxx11::string::operator+=((string *)local_e0,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::operator+=((string *)local_e0,"!\nConsider to\n  - add #include \"");
      std::__cxx11::string::operator+=((string *)local_e0,(string *)local_70);
      std::__cxx11::string::operator+=
                ((string *)local_e0,".moc\"\n  - enable SKIP_AUTOMOC for this file");
      JobT::LogFileError((JobT *)this,MOC,&filename->FileName,(string *)local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      this_local._7_1_ = 0;
    }
LAB_001facd3:
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(sourceBase.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoMocUic::JobEvaluateT::MocEvalSource(
  SourceFileHandleT const& source)
{
  SourceFileT const& sourceFile = *source;
  auto const& parseData = sourceFile.ParseData->Moc;
  if (!sourceFile.Moc ||
      (parseData.Macro.empty() && parseData.Include.Underscore.empty() &&
       parseData.Include.Dot.empty())) {
    return true;
  }

  std::string const sourceDir = SubDirPrefix(sourceFile.FileName);
  std::string const sourceBase =
    cmSystemTools::GetFilenameWithoutLastExtension(sourceFile.FileName);

  // For relaxed mode check if the own "moc_" or ".moc" file is included
  bool const relaxedMode = MocConst().RelaxedMode;
  bool sourceIncludesMocUnderscore = false;
  bool sourceIncludesDotMoc = false;
  // Check if the sources own "moc_" or ".moc" file is included
  if (relaxedMode) {
    for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
      if (incKey.Base == sourceBase) {
        sourceIncludesMocUnderscore = true;
        break;
      }
    }
  }
  for (IncludeKeyT const& incKey : parseData.Include.Dot) {
    if (incKey.Base == sourceBase) {
      sourceIncludesDotMoc = true;
      break;
    }
  }

  // Check if this source needs to be moc processed but doesn't.
  if (!sourceIncludesDotMoc && !parseData.Macro.empty() &&
      !(relaxedMode && sourceIncludesMocUnderscore)) {
    {
      std::string emsg = "The file contains a ";
      emsg += Quoted(parseData.Macro);
      emsg += " macro, but does not include ";
      emsg += Quoted(sourceBase + ".moc");
      emsg += "!\nConsider to\n  - add #include \"";
      emsg += sourceBase;
      emsg += ".moc\"\n  - enable SKIP_AUTOMOC for this file";
      LogFileError(GenT::MOC, sourceFile.FileName, emsg);
    }
    return false;
  }

  // Evaluate "moc_" includes
  for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
    std::string const headerBase = incKey.Dir + incKey.Base;
    SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
    if (!header) {
      {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nbut the header could not be found "
               "in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
      }
      return false;
    }
    // The include might be handled differently in relaxed mode
    if (relaxedMode && !sourceIncludesDotMoc && !parseData.Macro.empty() &&
        (incKey.Base == sourceBase)) {
      // The <BASE>.cpp file includes a Qt macro but does not include the
      // <BASE>.moc file. In this case, the moc_<BASE>.cpp should probably
      // be generated from <BASE>.cpp instead of <BASE>.h, because otherwise
      // it won't build. But warn, since this is not how it is supposed to be
      // used. This is for KDE4 compatibility.
      {
        // Issue a warning
        std::string msg = "The file contains a ";
        msg += Quoted(parseData.Macro);
        msg += " macro, but does not include ";
        msg += Quoted(sourceBase + ".moc");
        msg += ".\nInstead it includes ";
        msg += Quoted(incKey.Key);
        msg += ".\nRunning moc on the source\n  ";
        msg += Quoted(sourceFile.FileName);
        msg += "!\nBetter include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
      continue;
    }

    // Check if header is skipped
    if (MocConst().skipped(header->FileName)) {
      continue;
    }
    // Create mapping
    if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
      return false;
    }
  }

  // Evaluate ".moc" includes
  if (relaxedMode) {
    // Relaxed mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (ownMoc && !parseData.Macro.empty()) {
        // Create mapping for the regular use case
        if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
          return false;
        }
        continue;
      }
      // Try to find a header instead but issue a warning.
      // This is for KDE4 compatibility.
      std::string const headerBase = incKey.Dir + incKey.Base;
      SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
      if (!header) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different source "
               "file.\nCMAKE_AUTOMOC_RELAXED_MODE: Also a matching header"
               "could not be found in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Check if header is skipped
      if (MocConst().skipped(header->FileName)) {
        continue;
      }
      // Issue a warning
      if (ownMoc && parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a\n";
        msg += MocConst().MacrosString();
        msg += " macro.\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for a compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      } else {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += " instead of ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += ".\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
        return false;
      }
    }
  } else {
    // Strict mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (!ownMoc) {
        // Don't allow <BASE>.moc include other than own in regular mode
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different "
               "source file.\nThis is not supported.  Include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " to run moc on this source file.";
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Accept but issue a warning if moc isn't required
      if (parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a ";
        msg += MocConst().MacrosString();
        msg += " macro.";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
    }
  }

  return true;
}